

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O3

void rr::(anonymous_namespace)::
     drawBasicPrimitives<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
               (RenderState *state,RenderTarget *renderTarget,Program *program,
               vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *primList,
               VertexPacketAllocator *vpalloc)

{
  value_type *pvVar1;
  double *pdVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  float *pfVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  deUint32 dVar8;
  deUint32 dVar9;
  deUint32 dVar10;
  deUint32 dVar11;
  ClipVolumePlane *pCVar12;
  VertexPacket *pVVar13;
  pointer pTVar14;
  pointer pFVar15;
  pointer pFVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  undefined8 uVar23;
  double dVar24;
  ClipFloat CVar25;
  value_type *pvVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  pointer pTVar32;
  undefined4 uVar33;
  undefined1 auVar34 [12];
  bool bVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  TextureChannelClass TVar39;
  double *pdVar40;
  pointer pTVar41;
  value_type *pvVar42;
  TriangleVertex *pTVar43;
  pointer pTVar44;
  long lVar45;
  VertexPacket *pVVar46;
  VertexPacket *pVVar47;
  VertexPacket *pVVar48;
  pointer pTVar49;
  void *pvVar50;
  void *pvVar51;
  byte bVar52;
  vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_> *pvVar53;
  long lVar54;
  ulong uVar55;
  long lVar56;
  undefined1 auVar57 [8];
  double *pdVar58;
  pointer pTVar59;
  pointer pTVar60;
  ulong uVar61;
  byte bVar62;
  ulong uVar63;
  GeometryShader *pGVar64;
  Triangle *__args;
  long lVar65;
  ulong uVar66;
  double *pdVar67;
  pointer pTVar68;
  long lVar69;
  pointer pTVar70;
  ChannelType channelType;
  TriangleVertex *__cur;
  pointer pTVar71;
  value_type *pvVar72;
  Vec4 *p;
  VertexShader *pVVar73;
  value_type *pvVar74;
  long lVar75;
  pointer pVVar76;
  long lVar77;
  pointer pVVar78;
  int i_5;
  pointer pTVar79;
  Vec4 *v0;
  TriangleVertex *inside;
  value_type *pvVar80;
  Vec4 *v1;
  TriangleVertex *outside;
  _Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
  *this;
  ulong uVar81;
  long lVar82;
  uint uVar83;
  uint uVar84;
  uint uVar85;
  uint uVar86;
  uint uVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  double extraout_XMM0_Qa;
  double dVar92;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  uint extraout_XMM0_Dc;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  uint extraout_XMM0_Db_01;
  uint extraout_XMM0_Dc_00;
  uint extraout_XMM0_Dc_01;
  uint extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  uint extraout_XMM0_Dd_01;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar102;
  float fVar108;
  float fVar109;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar110;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar111;
  undefined1 auVar112 [16];
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar118;
  undefined1 auVar117 [16];
  undefined1 auStack_384 [8];
  undefined1 local_388 [16];
  float fStack_37c;
  undefined1 local_378 [8];
  ulong uStack_370;
  undefined4 local_358;
  undefined4 uStack_354;
  vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
  local_348;
  vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> outputTriangles;
  undefined1 local_308 [16];
  double *local_2e0;
  ClipVec4 anotherPointOnLine;
  ClipVec4 approximatedClipPoint;
  TriangleVertex mid2;
  long lStack_210;
  double dStack_1f0;
  bool clippedByPlane [6];
  ComponentPlane<_1,_0> clipNegX;
  double dStack_1b0;
  TriangleVertex mid1;
  FaceType local_c8;
  ComponentPlane<1,_0> clipPosX;
  ComponentPlane<1,_0> CStack_a0;
  ClipVolumePlane *planes [6];
  ComponentPlane<_1,_2> clipNegZ;
  ComponentPlane<1,_2> clipPosZ;
  ComponentPlane<_1,_1> clipNegY;
  ComponentPlane<1,_1> clipPosY;
  
  pVVar73 = program->vertexShader;
  pGVar64 = program->geometryShader;
  pvVar53 = &pGVar64->m_outputs;
  if (pGVar64 == (GeometryShader *)0x0) {
    pvVar53 = &pVVar73->m_outputs;
  }
  bVar35 = (state->fragOps).depthClampEnabled;
  pVVar76 = (pvVar53->
            super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pVVar78 = (pvVar53->
            super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (pVVar78 != pVVar76) {
    uVar63 = 0;
    do {
      if ((pVVar76[uVar63].flatshade == true) &&
         (pTVar60 = (primList->
                    super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>)._M_impl
                    .super__Vector_impl_data._M_start,
         pTVar60 !=
         (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>)._M_impl
         .super__Vector_impl_data._M_finish)) {
        do {
          if (pTVar60->provokingIndex == 2) {
            pTVar59 = (pointer)&pTVar60->v2;
          }
          else {
            pTVar59 = pTVar60;
            if (pTVar60->provokingIndex == 1) {
              pTVar59 = (pointer)&pTVar60->v1;
            }
          }
          pVVar46 = pTVar59->v0;
          dVar8 = pVVar46->outputs[uVar63].v.uData[0];
          dVar9 = pVVar46->outputs[uVar63].v.uData[1];
          dVar10 = pVVar46->outputs[uVar63].v.uData[2];
          dVar11 = pVVar46->outputs[uVar63].v.uData[3];
          pVVar46 = pTVar60->v0;
          pVVar46->outputs[uVar63].v.uData[0] = dVar8;
          pVVar46->outputs[uVar63].v.uData[1] = dVar9;
          pVVar46->outputs[uVar63].v.uData[2] = dVar10;
          pVVar46->outputs[uVar63].v.uData[3] = dVar11;
          pVVar46 = pTVar60->v1;
          pVVar46->outputs[uVar63].v.uData[0] = dVar8;
          pVVar46->outputs[uVar63].v.uData[1] = dVar9;
          pVVar46->outputs[uVar63].v.uData[2] = dVar10;
          pVVar46->outputs[uVar63].v.uData[3] = dVar11;
          pVVar46 = pTVar60->v2;
          pVVar46->outputs[uVar63].v.uData[0] = dVar8;
          pVVar46->outputs[uVar63].v.uData[1] = dVar9;
          pVVar46->outputs[uVar63].v.uData[2] = dVar10;
          pVVar46->outputs[uVar63].v.uData[3] = dVar11;
          pTVar60 = pTVar60 + 1;
        } while (pTVar60 !=
                 (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>)
                 ._M_impl.super__Vector_impl_data._M_finish);
        pVVar76 = (pvVar53->
                  super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>)
                  ._M_impl.super__Vector_impl_data._M_start;
        pVVar78 = (pvVar53->
                  super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>)
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar63 = uVar63 + 1;
    } while (uVar63 < (ulong)((long)pVVar78 - (long)pVVar76 >> 3));
    pVVar73 = program->vertexShader;
    pGVar64 = program->geometryShader;
  }
  CStack_a0 = (ComponentPlane<1,_0>)clipPosX.super_ClipVolumePlane._vptr_ClipVolumePlane;
  clipPosX.super_ClipVolumePlane._vptr_ClipVolumePlane =
       (ClipVolumePlane)(ClipVolumePlane)&PTR_pointInClipVolume_0217eed0;
  clipNegX.super_ClipVolumePlane._vptr_ClipVolumePlane =
       (ClipVolumePlane)&PTR_pointInClipVolume_0217ef20;
  clipPosY.super_ClipVolumePlane._vptr_ClipVolumePlane =
       (ClipVolumePlane)&PTR_pointInClipVolume_0217ef60;
  clipNegY.super_ClipVolumePlane._vptr_ClipVolumePlane =
       (ClipVolumePlane)&PTR_pointInClipVolume_0217efa0;
  clipPosZ.super_ClipVolumePlane._vptr_ClipVolumePlane =
       (ClipVolumePlane)&PTR_pointInClipVolume_0217efe0;
  pvVar53 = &pVVar73->m_outputs;
  if (pGVar64 != (GeometryShader *)0x0) {
    pvVar53 = &pGVar64->m_outputs;
  }
  clipNegZ.super_ClipVolumePlane._vptr_ClipVolumePlane =
       (ClipVolumePlane)&PTR_pointInClipVolume_0217f020;
  planes[0] = &clipPosX.super_ClipVolumePlane;
  planes[1] = &clipNegX.super_ClipVolumePlane;
  planes[2] = &clipPosY.super_ClipVolumePlane;
  planes[3] = &clipNegY.super_ClipVolumePlane;
  planes[4] = &clipPosZ.super_ClipVolumePlane;
  planes[5] = &clipNegZ.super_ClipVolumePlane;
  outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar60 = (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pTVar59 = (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if ((int)((ulong)((long)pTVar59 - (long)pTVar60) >> 5) < 1) {
    outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pTVar49 = (pointer)0x0;
    pTVar70 = (pointer)0x0;
  }
  else {
    lVar75 = (ulong)(bVar35 ^ 1) * 2 + 4;
    lVar69 = 0;
    do {
      bVar35 = true;
      lVar54 = 0;
      do {
        auVar107._12_4_ = 0;
        auVar107._0_12_ = stack0xfffffffffffffc8c;
        _local_378 = auVar107 << 0x20;
        lVar45 = lVar54;
        while( true ) {
          lVar54 = lVar45 + 1;
          pCVar12 = planes[lVar45];
          pVVar46 = (primList->
                    super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>)._M_impl
                    .super__Vector_impl_data._M_start[lVar69].v0;
          uVar6 = *(undefined8 *)(pVVar46->position).m_data;
          mid1.position.m_data[0] = (double)(float)uVar6;
          mid1.position.m_data[1] = (double)(float)((ulong)uVar6 >> 0x20);
          uVar6 = *(undefined8 *)((pVVar46->position).m_data + 2);
          mid1.position.m_data[2] = (double)(float)uVar6;
          mid1.position.m_data[3] = (double)(float)((ulong)uVar6 >> 0x20);
          iVar36 = (**pCVar12->_vptr_ClipVolumePlane)(pCVar12,&mid1);
          pVVar46 = (primList->
                    super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>)._M_impl
                    .super__Vector_impl_data._M_start[lVar69].v1;
          uVar6 = *(undefined8 *)(pVVar46->position).m_data;
          mid1.position.m_data[0] = (double)(float)uVar6;
          mid1.position.m_data[1] = (double)(float)((ulong)uVar6 >> 0x20);
          uVar6 = *(undefined8 *)((pVVar46->position).m_data + 2);
          mid1.position.m_data[2] = (double)(float)uVar6;
          mid1.position.m_data[3] = (double)(float)((ulong)uVar6 >> 0x20);
          iVar37 = (**pCVar12->_vptr_ClipVolumePlane)(pCVar12,&mid1);
          pVVar46 = (primList->
                    super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>)._M_impl
                    .super__Vector_impl_data._M_start[lVar69].v2;
          uVar6 = *(undefined8 *)(pVVar46->position).m_data;
          mid1.position.m_data[0] = (double)(float)uVar6;
          mid1.position.m_data[1] = (double)(float)((ulong)uVar6 >> 0x20);
          uVar6 = *(undefined8 *)((pVVar46->position).m_data + 2);
          mid1.position.m_data[2] = (double)(float)uVar6;
          mid1.position.m_data[3] = (double)(float)((ulong)uVar6 >> 0x20);
          iVar38 = (**pCVar12->_vptr_ClipVolumePlane)(pCVar12);
          if (((byte)iVar36 == 0 && (byte)iVar37 == 0) && (byte)iVar38 == 0) goto LAB_0195d54f;
          if ((byte)((byte)iVar36 & (byte)iVar37 & (byte)iVar38) != 1) break;
          clippedByPlane[lVar45] = false;
          lVar45 = lVar54;
          if (lVar54 == lVar75) {
            if (!bVar35) goto LAB_0195c1d7;
            __args = (primList->
                     super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
                     _M_impl.super__Vector_impl_data._M_start + lVar69;
            if (outputTriangles.
                super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                outputTriangles.
                super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>::
              _M_realloc_insert<rr::pa::Triangle_const&>
                        ((vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>> *)
                         &outputTriangles,
                         (iterator)
                         outputTriangles.
                         super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>.
                         _M_impl.super__Vector_impl_data._M_finish,__args);
            }
            else {
              pVVar46 = __args->v0;
              pVVar47 = __args->v1;
              iVar36 = __args->provokingIndex;
              uVar33 = *(undefined4 *)&__args->field_0x1c;
              (outputTriangles.
               super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
               super__Vector_impl_data._M_finish)->v2 = __args->v2;
              (outputTriangles.
               super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
               super__Vector_impl_data._M_finish)->provokingIndex = iVar36;
              *(undefined4 *)
               &(outputTriangles.
                 super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
                 super__Vector_impl_data._M_finish)->field_0x1c = uVar33;
              (outputTriangles.
               super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
               super__Vector_impl_data._M_finish)->v0 = pVVar46;
              (outputTriangles.
               super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
               super__Vector_impl_data._M_finish)->v1 = pVVar47;
              outputTriangles.
              super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   outputTriangles.
                   super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            goto LAB_0195d54f;
          }
        }
        bVar35 = false;
        clippedByPlane[lVar45] = true;
      } while (lVar75 != lVar54);
LAB_0195c1d7:
      pdVar40 = (double *)operator_new(0xa8);
      local_2e0 = pdVar40 + 0x15;
      memset(pdVar40,0,0xa8);
      pTVar60 = (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
                _M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)((pTVar60[lVar69].v0)->position).m_data;
      uVar7 = *(undefined8 *)(((pTVar60[lVar69].v0)->position).m_data + 2);
      *pdVar40 = (double)(float)uVar6;
      pdVar40[1] = (double)(float)((ulong)uVar6 >> 0x20);
      pdVar40[2] = (double)(float)uVar7;
      pdVar40[3] = (double)(float)((ulong)uVar7 >> 0x20);
      pdVar40[4] = 1.0;
      *(undefined1 (*) [16])(pdVar40 + 5) = ZEXT816(0);
      uVar6 = *(undefined8 *)((pTVar60[lVar69].v1)->position).m_data;
      uVar7 = *(undefined8 *)(((pTVar60[lVar69].v1)->position).m_data + 2);
      pdVar40[7] = (double)(float)uVar6;
      pdVar40[8] = (double)(float)((ulong)uVar6 >> 0x20);
      pdVar40[9] = (double)(float)uVar7;
      pdVar40[10] = (double)(float)((ulong)uVar7 >> 0x20);
      pdVar40[0xc] = 1.0;
      uVar6 = *(undefined8 *)((pTVar60[lVar69].v2)->position).m_data;
      auVar101._0_8_ = (double)(float)uVar6;
      auVar101._8_8_ = (double)(float)((ulong)uVar6 >> 0x20);
      uVar6 = *(undefined8 *)(((pTVar60[lVar69].v2)->position).m_data + 2);
      auVar100._0_8_ = (double)(float)uVar6;
      auVar100._8_8_ = (double)(float)((ulong)uVar6 >> 0x20);
      *(undefined1 (*) [16])(pdVar40 + 0xe) = auVar101;
      *(undefined1 (*) [16])(pdVar40 + 0x10) = auVar100;
      *(undefined1 (*) [16])(pdVar40 + 0x12) = ZEXT816(0);
      local_358 = SUB84(pdVar40,0);
      uStack_354 = (undefined4)((ulong)pdVar40 >> 0x20);
      pdVar40[0x14] = 1.0;
      lVar54 = 0;
      local_388._0_8_ = local_2e0;
      do {
        if (clippedByPlane[lVar54] == true) {
          lVar45 = CONCAT44(uStack_354,local_358);
          uVar83 = (int)(local_388._0_8_ - lVar45 >> 3) * 0x3cf3cf3d;
          if ((int)uVar83 < 1) {
            auVar29._8_8_ = 0;
            auVar29._0_8_ = local_308._8_8_;
            local_308 = auVar29 << 0x40;
            local_388._0_8_ = (double *)0x0;
            auVar30._8_8_ = 0;
            auVar30._0_8_ = uStack_370;
            _local_378 = auVar30 << 0x40;
          }
          else {
            uVar63 = 0;
            auVar27._8_8_ = 0;
            auVar27._0_8_ = uStack_370;
            _local_378 = auVar27 << 0x40;
            local_388._0_8_ = (double *)0x0;
            auVar28._8_8_ = 0;
            auVar28._0_8_ = local_308._8_8_;
            local_308 = auVar28 << 0x40;
            do {
              local_348.
              super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_348.
              super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_348.
              super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              pvVar74 = (value_type *)(uVar63 * 0xa8 + CONCAT44(uStack_354,local_358));
              pCVar12 = planes[lVar54];
              iVar36 = (**pCVar12->_vptr_ClipVolumePlane)(pCVar12,pvVar74);
              pvVar42 = pvVar74 + 1;
              iVar37 = (**pCVar12->_vptr_ClipVolumePlane)(pCVar12,pvVar42);
              pvVar1 = pvVar74 + 2;
              iVar38 = (**pCVar12->_vptr_ClipVolumePlane)(pCVar12);
              pTVar44 = local_348.
                        super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              pTVar79 = local_348.
                        super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              pTVar68 = local_348.
                        super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              bVar52 = (byte)iVar36;
              bVar62 = (byte)iVar37;
              iVar36 = (uint)(byte)((byte)iVar38 ^ 1) + (uint)(bVar62 ^ 1) + (uint)(bVar52 ^ 1);
              if (iVar36 == 2) {
                pvVar72 = pvVar42;
                pvVar80 = pvVar1;
                pvVar26 = pvVar74;
                if (bVar62 != 0) {
                  pvVar72 = pvVar74;
                  pvVar80 = pvVar42;
                  pvVar26 = pvVar1;
                }
                if (bVar52 != 0) {
                  pvVar72 = pvVar1;
                  pvVar80 = pvVar74;
                  pvVar26 = pvVar42;
                }
                mid1.position.m_data[2]._0_4_ = 0;
                mid1.position.m_data[2]._4_4_ = 0;
                mid1.position.m_data[3]._0_4_ = 0;
                mid1.position.m_data[3]._4_4_ = 0;
                mid1.position.m_data[0] = 0.0;
                mid1.position.m_data[1]._0_4_ = 0;
                mid1.position.m_data[1]._4_4_ = 0;
                mid2.position.m_data._16_16_ = ZEXT816(0);
                mid2.position.m_data._0_16_ = ZEXT816(0);
                (*pCVar12->_vptr_ClipVolumePlane[1])(pCVar12,pvVar80,pvVar26);
                if (extraout_XMM0_Qa_01 < 1.0) {
                  approximatedClipPoint.m_data[2] = 0.0;
                  approximatedClipPoint.m_data[3] = 0.0;
                  approximatedClipPoint.m_data[0] = 0.0;
                  approximatedClipPoint.m_data[1] = 0.0;
                  dVar92 = 1.0 - extraout_XMM0_Qa_01;
                  lVar56 = 0;
                  do {
                    pdVar40 = (pvVar80->position).m_data + lVar56;
                    dVar21 = pdVar40[1];
                    pdVar2 = (pvVar26->position).m_data + lVar56;
                    dVar22 = pdVar2[1];
                    approximatedClipPoint.m_data[lVar56] =
                         *pdVar40 * dVar92 + *pdVar2 * extraout_XMM0_Qa_01;
                    approximatedClipPoint.m_data[lVar56 + 1] =
                         dVar21 * dVar92 + dVar22 * extraout_XMM0_Qa_01;
                    lVar56 = lVar56 + 2;
                  } while (lVar56 != 4);
                  auVar19._8_4_ = SUB84(dVar92,0);
                  auVar19._0_8_ = dVar92;
                  auVar19._12_4_ = (int)((ulong)dVar92 >> 0x20);
                  pvVar42 = pvVar26;
                  if (0.5 < extraout_XMM0_Qa_01) {
                    pvVar42 = pvVar80;
                  }
                  anotherPointOnLine.m_data[0] = (pvVar42->position).m_data[0];
                  anotherPointOnLine.m_data[1] = (pvVar42->position).m_data[1];
                  anotherPointOnLine.m_data[2] = (pvVar42->position).m_data[2];
                  anotherPointOnLine.m_data[3] = (pvVar42->position).m_data[3];
                  (*pCVar12->_vptr_ClipVolumePlane[2])
                            (&mid1,pCVar12,&approximatedClipPoint,&anotherPointOnLine);
                  dStack_1f0 = auVar19._8_8_;
                  mid1.weight[0] =
                       pvVar80->weight[0] * dVar92 + extraout_XMM0_Qa_01 * pvVar26->weight[0];
                  mid1.weight[1] =
                       pvVar80->weight[1] * dStack_1f0 + extraout_XMM0_Qa_01 * pvVar26->weight[1];
                  mid1.weight[2] =
                       dVar92 * pvVar80->weight[2] + pvVar26->weight[2] * extraout_XMM0_Qa_01;
                }
                (*pCVar12->_vptr_ClipVolumePlane[1])(pCVar12,pvVar80,pvVar72);
                if (1.0 <= extraout_XMM0_Qa_02) {
                  if (1.0 <= extraout_XMM0_Qa_01) goto LAB_0195cc3d;
                  pvVar42 = &mid1;
                }
                else {
                  approximatedClipPoint.m_data[2] = 0.0;
                  approximatedClipPoint.m_data[3] = 0.0;
                  approximatedClipPoint.m_data[0] = 0.0;
                  approximatedClipPoint.m_data[1] = 0.0;
                  dVar92 = 1.0 - extraout_XMM0_Qa_02;
                  lVar56 = 0;
                  do {
                    pdVar40 = (pvVar80->position).m_data + lVar56;
                    dVar21 = pdVar40[1];
                    pdVar2 = (pvVar72->position).m_data + lVar56;
                    dVar22 = pdVar2[1];
                    approximatedClipPoint.m_data[lVar56] =
                         *pdVar40 * dVar92 + *pdVar2 * extraout_XMM0_Qa_02;
                    approximatedClipPoint.m_data[lVar56 + 1] =
                         dVar21 * dVar92 + dVar22 * extraout_XMM0_Qa_02;
                    lVar56 = lVar56 + 2;
                  } while (lVar56 != 4);
                  auVar20._8_4_ = SUB84(dVar92,0);
                  auVar20._0_8_ = dVar92;
                  auVar20._12_4_ = (int)((ulong)dVar92 >> 0x20);
                  pvVar42 = pvVar72;
                  if (0.5 < extraout_XMM0_Qa_02) {
                    pvVar42 = pvVar80;
                  }
                  anotherPointOnLine.m_data[0] = (pvVar42->position).m_data[0];
                  anotherPointOnLine.m_data[1] = (pvVar42->position).m_data[1];
                  anotherPointOnLine.m_data[2] = (pvVar42->position).m_data[2];
                  anotherPointOnLine.m_data[3] = (pvVar42->position).m_data[3];
                  (*pCVar12->_vptr_ClipVolumePlane[2])
                            (&mid2,pCVar12,&approximatedClipPoint,&anotherPointOnLine);
                  dStack_1b0 = auVar20._8_8_;
                  mid2.weight[1] =
                       pvVar80->weight[1] * dStack_1b0 + extraout_XMM0_Qa_02 * pvVar72->weight[1];
                  mid2.weight[0] =
                       pvVar80->weight[0] * dVar92 + extraout_XMM0_Qa_02 * pvVar72->weight[0];
                  mid2.weight[2] =
                       dVar92 * pvVar80->weight[2] + pvVar72->weight[2] * extraout_XMM0_Qa_02;
                  pvVar72 = &mid2;
                  pvVar42 = &mid1;
                  if (1.0 <= extraout_XMM0_Qa_01) {
LAB_0195cc3d:
                    pvVar42 = pvVar26;
                  }
                }
                std::
                vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                ::push_back(&local_348,pvVar80);
                std::
                vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                ::push_back(&local_348,pvVar42);
                std::
                vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                ::push_back(&local_348,pvVar72);
              }
              else if (iVar36 == 1) {
                pvVar80 = pvVar74;
                pTVar43 = pvVar42;
                pvVar72 = pvVar1;
                if (bVar62 != 0) {
                  pvVar80 = pvVar42;
                  pTVar43 = pvVar1;
                  pvVar72 = pvVar74;
                }
                if (bVar52 == 0) {
                  pvVar80 = pvVar1;
                  pTVar43 = pvVar74;
                  pvVar72 = pvVar42;
                }
                mid1.position.m_data[2]._0_4_ = 0;
                mid1.position.m_data[2]._4_4_ = 0;
                mid1.position.m_data[3]._0_4_ = 0;
                mid1.position.m_data[3]._4_4_ = 0;
                mid1.position.m_data[0] = 0.0;
                mid1.position.m_data[1]._0_4_ = 0;
                mid1.position.m_data[1]._4_4_ = 0;
                mid2.position.m_data._16_16_ = ZEXT816(0);
                mid2.position.m_data._0_16_ = ZEXT816(0);
                (*pCVar12->_vptr_ClipVolumePlane[1])(pCVar12,pvVar72,pTVar43);
                if (extraout_XMM0_Qa < 1.0) {
                  approximatedClipPoint.m_data[2] = 0.0;
                  approximatedClipPoint.m_data[3] = 0.0;
                  approximatedClipPoint.m_data[0] = 0.0;
                  approximatedClipPoint.m_data[1] = 0.0;
                  dVar92 = 1.0 - extraout_XMM0_Qa;
                  lVar56 = 0;
                  do {
                    pdVar40 = (pvVar72->position).m_data + lVar56;
                    dVar21 = pdVar40[1];
                    pdVar2 = (pTVar43->position).m_data + lVar56;
                    dVar22 = pdVar2[1];
                    approximatedClipPoint.m_data[lVar56] =
                         *pdVar40 * dVar92 + *pdVar2 * extraout_XMM0_Qa;
                    approximatedClipPoint.m_data[lVar56 + 1] =
                         dVar21 * dVar92 + dVar22 * extraout_XMM0_Qa;
                    lVar56 = lVar56 + 2;
                  } while (lVar56 != 4);
                  auVar17._8_4_ = SUB84(dVar92,0);
                  auVar17._0_8_ = dVar92;
                  auVar17._12_4_ = (int)((ulong)dVar92 >> 0x20);
                  pvVar42 = pTVar43;
                  if (0.5 < extraout_XMM0_Qa) {
                    pvVar42 = pvVar72;
                  }
                  anotherPointOnLine.m_data[0] = (pvVar42->position).m_data[0];
                  anotherPointOnLine.m_data[1] = (pvVar42->position).m_data[1];
                  anotherPointOnLine.m_data[2] = (pvVar42->position).m_data[2];
                  anotherPointOnLine.m_data[3] = (pvVar42->position).m_data[3];
                  (*pCVar12->_vptr_ClipVolumePlane[2])
                            (&mid1,pCVar12,&approximatedClipPoint,&anotherPointOnLine);
                  dStack_1f0 = auVar17._8_8_;
                  mid1.weight[0] =
                       pvVar72->weight[0] * dVar92 + extraout_XMM0_Qa * pTVar43->weight[0];
                  mid1.weight[1] =
                       pvVar72->weight[1] * dStack_1f0 + extraout_XMM0_Qa * pTVar43->weight[1];
                  mid1.weight[2] =
                       dVar92 * pvVar72->weight[2] + pTVar43->weight[2] * extraout_XMM0_Qa;
                }
                (*pCVar12->_vptr_ClipVolumePlane[1])(pCVar12,pvVar80,pTVar43);
                if (extraout_XMM0_Qa_00 < 1.0) {
                  approximatedClipPoint.m_data[2] = 0.0;
                  approximatedClipPoint.m_data[3] = 0.0;
                  approximatedClipPoint.m_data[0] = 0.0;
                  approximatedClipPoint.m_data[1] = 0.0;
                  dVar92 = 1.0 - extraout_XMM0_Qa_00;
                  lVar56 = 0;
                  do {
                    pdVar2 = (pvVar80->position).m_data + lVar56;
                    dVar21 = pdVar2[1];
                    pdVar40 = (pTVar43->position).m_data + lVar56;
                    dVar22 = pdVar40[1];
                    approximatedClipPoint.m_data[lVar56] =
                         *pdVar2 * dVar92 + *pdVar40 * extraout_XMM0_Qa_00;
                    approximatedClipPoint.m_data[lVar56 + 1] =
                         dVar21 * dVar92 + dVar22 * extraout_XMM0_Qa_00;
                    lVar56 = lVar56 + 2;
                  } while (lVar56 != 4);
                  auVar18._8_4_ = SUB84(dVar92,0);
                  auVar18._0_8_ = dVar92;
                  auVar18._12_4_ = (int)((ulong)dVar92 >> 0x20);
                  pvVar42 = pTVar43;
                  if (0.5 < extraout_XMM0_Qa_00) {
                    pvVar42 = pvVar80;
                  }
                  anotherPointOnLine.m_data[0] = (pvVar42->position).m_data[0];
                  anotherPointOnLine.m_data[1] = (pvVar42->position).m_data[1];
                  anotherPointOnLine.m_data[2] = (pvVar42->position).m_data[2];
                  anotherPointOnLine.m_data[3] = (pvVar42->position).m_data[3];
                  (*pCVar12->_vptr_ClipVolumePlane[2])
                            (&mid2,pCVar12,&approximatedClipPoint,&anotherPointOnLine);
                  dStack_1b0 = auVar18._8_8_;
                  mid2.weight[1] =
                       pvVar80->weight[1] * dStack_1b0 + extraout_XMM0_Qa_00 * pTVar43->weight[1];
                  mid2.weight[0] =
                       pvVar80->weight[0] * dVar92 + extraout_XMM0_Qa_00 * pTVar43->weight[0];
                  mid2.weight[2] =
                       dVar92 * pvVar80->weight[2] + pTVar43->weight[2] * extraout_XMM0_Qa_00;
                  if (extraout_XMM0_Qa < 1.0) {
                    std::
                    vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                    ::push_back(&local_348,pvVar72);
                    pvVar72 = &mid1;
                    pTVar43 = &mid2;
                  }
                }
                std::
                vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                ::push_back(&local_348,pvVar72);
                std::
                vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                ::push_back(&local_348,pTVar43);
                std::
                vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                ::push_back(&local_348,pvVar80);
              }
              else if (iVar36 == 0) {
                pvVar42 = pvVar74 + 3;
                uVar61 = (long)local_348.
                               super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_348.
                               super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                uVar55 = ((long)uVar61 >> 3) * 0x6db6db6db6db6db7;
                if ((ulong)((long)local_348.
                                  super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                           (long)local_348.
                                 super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                 ._M_impl.super__Vector_impl_data._M_finish) < 0xa8) {
                  if (uVar55 + 0xfdb6db6db6db6db9 < 3) {
                    std::__throw_length_error("vector::_M_range_insert");
                  }
                  uVar61 = 3;
                  if (3 < uVar55) {
                    uVar61 = uVar55;
                  }
                  this = (_Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                          *)(uVar61 + uVar55);
                  if ((_Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                       *)0x249249249249248 < this) {
                    this = (_Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                            *)0x249249249249249;
                  }
                  if (CARRY8(uVar61,uVar55)) {
                    this = (_Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                            *)0x249249249249249;
                  }
                  pTVar41 = std::
                            _Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                            ::_M_allocate(this,0xa8);
                  pTVar71 = pTVar41;
                  do {
                    lVar56 = 0;
                    do {
                      (pTVar71->position).m_data[lVar56] = (pvVar74->position).m_data[lVar56];
                      lVar56 = lVar56 + 1;
                    } while (lVar56 != 4);
                    pTVar71->weight[2] = pvVar74->weight[2];
                    *(undefined1 (*) [16])pTVar71->weight = *(undefined1 (*) [16])pvVar74->weight;
                    pvVar74 = pvVar74 + 1;
                    pTVar71 = pTVar71 + 1;
                    pTVar32 = pTVar68;
                  } while (pvVar74 != pvVar42);
                  for (; pTVar79 != pTVar32; pTVar32 = pTVar32 + 1) {
                    lVar56 = 0;
                    do {
                      (pTVar71->position).m_data[lVar56] = (pTVar32->position).m_data[lVar56];
                      lVar56 = lVar56 + 1;
                    } while (lVar56 != 4);
                    pTVar71->weight[2] = pTVar32->weight[2];
                    *(undefined1 (*) [16])pTVar71->weight = *(undefined1 (*) [16])pTVar32->weight;
                    pTVar71 = pTVar71 + 1;
                  }
                  if (pTVar68 != (pointer)0x0) {
                    operator_delete(pTVar68,(long)pTVar44 - (long)pTVar68);
                  }
                  local_348.
                  super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar41 + (long)this;
                  local_348.
                  super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                  ._M_impl.super__Vector_impl_data._M_start = pTVar41;
                  local_348.
                  super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                  ._M_impl.super__Vector_impl_data._M_finish = pTVar71;
                }
                else if (uVar55 < 4) {
                  if (uVar61 != 0xa8) {
                    pvVar74 = (value_type *)((long)pvVar74 + uVar61);
                    pTVar68 = local_348.
                              super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                    do {
                      lVar56 = 0;
                      do {
                        (pTVar68->position).m_data[lVar56] = (pvVar74->position).m_data[lVar56];
                        lVar56 = lVar56 + 1;
                      } while (lVar56 != 4);
                      pTVar68->weight[2] = pvVar74->weight[2];
                      *(undefined1 (*) [16])pTVar68->weight = *(undefined1 (*) [16])pvVar74->weight;
                      pvVar74 = pvVar74 + 1;
                      pTVar68 = pTVar68 + 1;
                    } while (pvVar74 != pvVar42);
                  }
                  pTVar68 = local_348.
                            super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                            ._M_impl.super__Vector_impl_data._M_finish +
                            ((long)uVar61 >> 3) * -0x6db6db6db6db6db7 + 3;
                  for (pTVar79 = local_348.
                                 super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                      local_348.
                      super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                      ._M_impl.super__Vector_impl_data._M_finish != pTVar79; pTVar79 = pTVar79 + 1)
                  {
                    lVar56 = 0;
                    do {
                      (pTVar68->position).m_data[lVar56] = (pTVar79->position).m_data[lVar56];
                      lVar56 = lVar56 + 1;
                    } while (lVar56 != 4);
                    pTVar68->weight[2] = pTVar79->weight[2];
                    *(undefined1 (*) [16])pTVar68->weight = *(undefined1 (*) [16])pTVar79->weight;
                    pTVar68 = pTVar68 + 1;
                  }
                  local_348.
                  super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
                       (pointer)((long)(local_348.
                                        super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       ((long)uVar61 >> 3) * -0x6db6db6db6db6db7 + 3) + uVar61);
                  if (0 < (long)uVar61) {
                    uVar61 = uVar61 / 0x38 + 1;
                    lVar56 = 0;
                    do {
                      *(undefined8 *)
                       ((long)(local_348.
                               super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                               ._M_impl.super__Vector_impl_data._M_start)->weight + lVar56 + 0x10) =
                           *(undefined8 *)(lVar45 + 0x30 + lVar56);
                      auVar107 = *(undefined1 (*) [16])(lVar45 + lVar56);
                      auVar101 = *(undefined1 (*) [16])(lVar45 + 0x10 + lVar56);
                      *(undefined1 (*) [16])
                       ((long)(local_348.
                               super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                               ._M_impl.super__Vector_impl_data._M_start)->weight + lVar56) =
                           *(undefined1 (*) [16])(lVar45 + 0x20 + lVar56);
                      *(undefined1 (*) [16])
                       ((long)((local_348.
                                super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                ._M_impl.super__Vector_impl_data._M_start)->position).m_data +
                       lVar56 + 0x10) = auVar101;
                      *(undefined1 (*) [16])
                       ((long)((local_348.
                                super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                ._M_impl.super__Vector_impl_data._M_start)->position).m_data +
                       lVar56) = auVar107;
                      uVar61 = uVar61 - 1;
                      lVar56 = lVar56 + 0x38;
                    } while (1 < uVar61);
                  }
                }
                else {
                  lVar56 = -0xa8;
                  do {
                    puVar3 = (undefined8 *)
                             ((long)((local_348.
                                      super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                      ._M_impl.super__Vector_impl_data._M_finish)->position).m_data
                             + lVar56);
                    uVar6 = puVar3[1];
                    puVar4 = (undefined8 *)
                             ((long)((local_348.
                                      super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                      ._M_impl.super__Vector_impl_data._M_finish)->position).m_data
                             + lVar56 + 0x10);
                    uVar7 = *puVar4;
                    uVar23 = puVar4[1];
                    puVar4 = (undefined8 *)
                             ((long)local_348.
                                    super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                    ._M_impl.super__Vector_impl_data._M_finish[3].position.m_data +
                             lVar56);
                    *puVar4 = *puVar3;
                    puVar4[1] = uVar6;
                    puVar3 = (undefined8 *)
                             ((long)local_348.
                                    super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                    ._M_impl.super__Vector_impl_data._M_finish[3].position.m_data +
                             lVar56 + 0x10);
                    *puVar3 = uVar7;
                    puVar3[1] = uVar23;
                    puVar3 = (undefined8 *)
                             ((long)(local_348.
                                     super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->weight + lVar56);
                    uVar6 = puVar3[1];
                    puVar4 = (undefined8 *)
                             ((long)local_348.
                                    super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                    ._M_impl.super__Vector_impl_data._M_finish[3].weight + lVar56);
                    *puVar4 = *puVar3;
                    puVar4[1] = uVar6;
                    *(undefined8 *)
                     ((long)local_348.
                            super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                            ._M_impl.super__Vector_impl_data._M_finish[3].weight + lVar56 + 0x10) =
                         *(undefined8 *)
                          ((long)(local_348.
                                  super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                  ._M_impl.super__Vector_impl_data._M_finish)->weight +
                          lVar56 + 0x10);
                    lVar56 = lVar56 + 0x38;
                  } while (lVar56 != 0);
                  pTVar68 = local_348.
                            super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 3;
                  uVar61 = (long)local_348.
                                 super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                 ._M_impl.super__Vector_impl_data._M_finish +
                           (-0xa8 - (long)local_348.
                                          super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  if (0 < (long)uVar61) {
                    uVar61 = uVar61 / 0x38 + 1;
                    do {
                      local_348.
                      super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].weight[2] =
                           local_348.
                           super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-4].weight[2];
                      dVar92 = local_348.
                               super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                               ._M_impl.super__Vector_impl_data._M_finish[-4].position.m_data[0];
                      dVar21 = local_348.
                               super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                               ._M_impl.super__Vector_impl_data._M_finish[-4].position.m_data[1];
                      dVar22 = local_348.
                               super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                               ._M_impl.super__Vector_impl_data._M_finish[-4].position.m_data[2];
                      dVar24 = local_348.
                               super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                               ._M_impl.super__Vector_impl_data._M_finish[-4].position.m_data[3];
                      CVar25 = local_348.
                               super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                               ._M_impl.super__Vector_impl_data._M_finish[-4].weight[1];
                      local_348.
                      super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].weight[0] =
                           local_348.
                           super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-4].weight[0];
                      local_348.
                      super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].weight[1] = CVar25;
                      local_348.
                      super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].position.m_data[2] = dVar22;
                      local_348.
                      super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].position.m_data[3] = dVar24;
                      local_348.
                      super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].position.m_data[0] = dVar92;
                      local_348.
                      super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].position.m_data[1] = dVar21;
                      uVar61 = uVar61 - 1;
                      local_348.
                      super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                      ._M_impl.super__Vector_impl_data._M_finish =
                           local_348.
                           super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1;
                    } while (1 < uVar61);
                  }
                  uVar61 = 4;
                  lVar56 = 0;
                  do {
                    *(undefined8 *)
                     ((long)(local_348.
                             super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                             ._M_impl.super__Vector_impl_data._M_start)->weight + lVar56 + 0x10) =
                         *(undefined8 *)(lVar45 + 0x30 + lVar56);
                    auVar107 = *(undefined1 (*) [16])(lVar45 + lVar56);
                    auVar101 = *(undefined1 (*) [16])(lVar45 + 0x10 + lVar56);
                    *(undefined1 (*) [16])
                     ((long)(local_348.
                             super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                             ._M_impl.super__Vector_impl_data._M_start)->weight + lVar56) =
                         *(undefined1 (*) [16])(lVar45 + 0x20 + lVar56);
                    *(undefined1 (*) [16])
                     ((long)((local_348.
                              super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                              ._M_impl.super__Vector_impl_data._M_start)->position).m_data +
                     lVar56 + 0x10) = auVar101;
                    *(undefined1 (*) [16])
                     ((long)((local_348.
                              super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                              ._M_impl.super__Vector_impl_data._M_start)->position).m_data + lVar56)
                         = auVar107;
                    uVar61 = uVar61 - 1;
                    lVar56 = lVar56 + 0x38;
                    local_348.
                    super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                    ._M_impl.super__Vector_impl_data._M_finish = pTVar68;
                  } while (1 < uVar61);
                }
              }
              pTVar68 = local_348.
                        super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pTVar79 = local_348.
                        super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((local_348.
                   super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                   ._M_impl.super__Vector_impl_data._M_start !=
                   local_348.
                   super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish) &&
                 (2 < (int)((ulong)((long)local_348.
                                          super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_348.
                                         super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                      -0x49249249)) {
                lVar82 = 2;
                lVar56 = 1;
                pTVar44 = local_348.
                          super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                do {
                  auVar103._0_4_ = (float)pTVar79[lVar56].position.m_data[3];
                  auVar103._4_4_ = (float)(pTVar68->position).m_data[3];
                  auVar103._8_8_ = 0;
                  auVar96._0_4_ = (float)pTVar79[lVar56].position.m_data[0];
                  auVar96._4_4_ = (float)(pTVar68->position).m_data[0];
                  auVar96._8_8_ = 0;
                  auVar107 = divps(auVar96,auVar103);
                  fVar114 = (float)pTVar79[lVar82].position.m_data[3];
                  auVar117._0_4_ = (float)pTVar79[lVar82].position.m_data[1];
                  auVar117._4_4_ = (float)(pTVar68->position).m_data[1];
                  auVar117._8_8_ = 0;
                  auVar104._4_4_ = auVar103._4_4_;
                  auVar104._0_4_ = fVar114;
                  auVar104._8_8_ = 0;
                  auVar101 = divps(auVar117,auVar104);
                  fVar118 = auVar101._4_4_;
                  fVar114 = (auVar101._0_4_ - fVar118) * (auVar107._0_4_ - auVar107._4_4_) -
                            ((float)pTVar79[lVar82].position.m_data[0] / fVar114 - auVar107._4_4_) *
                            ((float)pTVar79[lVar56].position.m_data[1] / auVar103._0_4_ - fVar118);
                  auVar93._0_8_ = CONCAT44(fVar118,fVar114) ^ 0x8000000080000000;
                  auVar93._8_4_ = auVar101._8_4_ ^ 0x80000000;
                  auVar93._12_4_ = auVar101._12_4_ ^ 0x80000000;
                  if (-fVar114 <= fVar114) {
                    auVar93._0_4_ = fVar114;
                  }
                  if (1e-06 <= auVar93._0_4_) {
                    mid1.weight[2] = pTVar68->weight[2];
                    dVar92 = (pTVar68->position).m_data[1];
                    dVar21 = (pTVar68->position).m_data[2];
                    dVar22 = (pTVar68->position).m_data[3];
                    mid1.weight[0] = pTVar68->weight[0];
                    mid1.weight[1] = pTVar68->weight[1];
                    mid1.position.m_data[2]._0_4_ = SUB84(dVar21,0);
                    mid1.position.m_data[2]._4_4_ = (undefined4)((ulong)dVar21 >> 0x20);
                    mid1.position.m_data[3]._0_4_ = SUB84(dVar22,0);
                    mid1.position.m_data[3]._4_4_ = (undefined4)((ulong)dVar22 >> 0x20);
                    mid1.position.m_data[0] = (pTVar68->position).m_data[0];
                    mid1.position.m_data[1]._0_4_ = SUB84(dVar92,0);
                    mid1.position.m_data[1]._4_4_ = (int)((ulong)dVar92 >> 0x20);
                    if (local_388._0_8_ == local_308._0_8_) {
                      uVar61 = local_388._0_8_ - (long)local_378;
                      if (uVar61 == 0x7ffffffffffffff8) {
                        std::__throw_length_error("vector::_M_realloc_insert");
                      }
                      lVar65 = (long)uVar61 >> 3;
                      uVar81 = lVar65 * -0x30c30c30c30c30c3;
                      uVar55 = uVar81;
                      if ((undefined1  [8])local_388._0_8_ == local_378) {
                        uVar55 = 1;
                      }
                      uVar66 = uVar55 + uVar81;
                      if (0xc30c30c30c30c2 < uVar66) {
                        uVar66 = 0xc30c30c30c30c3;
                      }
                      if (CARRY8(uVar55,uVar81)) {
                        uVar66 = 0xc30c30c30c30c3;
                      }
                      if (uVar66 == 0) {
                        pdVar40 = (double *)0x0;
                      }
                      else {
                        pdVar40 = (double *)operator_new(uVar66 * 0xa8);
                      }
                      lVar77 = 0;
                      do {
                        uVar6 = *(undefined8 *)((long)mid1.position.m_data + lVar77);
                        uVar7 = *(undefined8 *)((long)mid1.position.m_data + lVar77 + 8);
                        *(undefined1 (*) [16])((long)pdVar40 + lVar77 + uVar61 + 0x10) =
                             *(undefined1 (*) [16])((long)mid1.position.m_data + lVar77 + 0x10);
                        puVar3 = (undefined8 *)((long)pdVar40 + lVar77 + uVar61);
                        *puVar3 = uVar6;
                        puVar3[1] = uVar7;
                        *(undefined8 *)((long)pdVar40 + lVar77 + lVar65 * 8 + 0x30) =
                             *(undefined8 *)((long)mid1.weight + lVar77 + 0x10);
                        *(undefined1 (*) [16])((long)pdVar40 + lVar77 + lVar65 * 8 + 0x20) =
                             *(undefined1 (*) [16])((long)mid1.weight + lVar77);
                        lVar77 = lVar77 + 0x38;
                        pdVar2 = pdVar40;
                        auVar57 = local_378;
                      } while (lVar77 != 0xa8);
                      for (; (undefined1  [8])local_388._0_8_ != auVar57;
                          auVar57 = (undefined1  [8])((long)auVar57 + 0xa8)) {
                        lVar65 = 0;
                        pdVar58 = (double *)auVar57;
                        pdVar67 = pdVar2;
                        do {
                          lVar77 = 0;
                          do {
                            pdVar67[lVar77] = pdVar58[lVar77];
                            lVar77 = lVar77 + 1;
                          } while (lVar77 != 4);
                          pdVar2[lVar65 * 7 + 6] = *(double *)((long)auVar57 + (lVar65 * 7 + 6) * 8)
                          ;
                          *(undefined1 (*) [16])(pdVar2 + lVar65 * 7 + 4) =
                               *(undefined1 (*) [16])((long)auVar57 + (lVar65 * 7 + 4) * 8);
                          lVar65 = lVar65 + 1;
                          pdVar67 = pdVar67 + 7;
                          pdVar58 = pdVar58 + 7;
                        } while (lVar65 != 3);
                        pdVar2 = pdVar2 + 0x15;
                      }
                      if (local_378 != (undefined1  [8])0x0) {
                        operator_delete((void *)local_378,uVar61);
                      }
                      local_308._0_8_ = pdVar40 + uVar66 * 0x15;
                      local_378 = (undefined1  [8])pdVar40;
                      local_388._0_8_ = pdVar2;
                    }
                    else {
                      pTVar43 = &mid1;
                      lVar65 = 0;
                      auVar57 = (undefined1  [8])local_388._0_8_;
                      do {
                        lVar77 = 0;
                        do {
                          *(double *)((long)auVar57 + lVar77 * 8) =
                               (pTVar43->position).m_data[lVar77];
                          lVar77 = lVar77 + 1;
                        } while (lVar77 != 4);
                        *(ClipFloat *)(local_388._0_8_ + (lVar65 * 7 + 6) * 8) =
                             (&mid1)[lVar65].weight[2];
                        *(undefined1 (*) [16])(local_388._0_8_ + (lVar65 * 7 + 4) * 8) =
                             *(undefined1 (*) [16])(&mid1)[lVar65].weight;
                        lVar65 = lVar65 + 1;
                        auVar57 = (undefined1  [8])((long)auVar57 + 0x38);
                        pTVar43 = pTVar43 + 1;
                      } while (lVar65 != 3);
                    }
                    local_388._0_8_ = local_388._0_8_ + 0xa8;
                    pTVar44 = local_348.
                              super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                    pTVar79 = local_348.
                              super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  }
                  lVar82 = lVar82 + 1;
                  lVar56 = lVar56 + 1;
                } while (lVar82 < (int)((ulong)((long)pTVar44 - (long)pTVar79) >> 3) * -0x49249249);
              }
              if (pTVar79 != (pointer)0x0) {
                operator_delete(pTVar79,(long)local_348.
                                              super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)pTVar79);
              }
              uVar63 = uVar63 + 1;
              lVar45 = lVar45 + 0xa8;
            } while (uVar63 != (uVar83 & 0x7fffffff));
          }
          pvVar50 = (void *)CONCAT44(uStack_354,local_358);
          if (pvVar50 != (void *)0x0) {
            operator_delete(pvVar50,(long)local_2e0 - (long)pvVar50);
          }
          local_358 = local_378._0_4_;
          uStack_354 = local_378._4_4_;
          local_2e0 = (double *)local_308._0_8_;
        }
        lVar54 = lVar54 + 1;
      } while (lVar54 != lVar75);
      uVar83 = (int)(local_388._0_8_ - CONCAT44(uStack_354,local_358) >> 3) * 0x3cf3cf3d;
      if (0 < (int)uVar83) {
        uVar63 = 0;
        do {
          pVVar46 = VertexPacketAllocator::alloc(vpalloc);
          pVVar47 = VertexPacketAllocator::alloc(vpalloc);
          pVVar48 = VertexPacketAllocator::alloc(vpalloc);
          mid1.position.m_data[0] = (double)pVVar46;
          mid1.position.m_data[1]._0_4_ = (int)pVVar47;
          mid1.position.m_data[1]._4_4_ = (int)((ulong)pVVar47 >> 0x20);
          mid1.position.m_data[2]._0_4_ = (int)pVVar48;
          mid1.position.m_data[2]._4_4_ = (undefined4)((ulong)pVVar48 >> 0x20);
          mid1.position.m_data[3]._0_4_ = 0xffffffff;
          lVar45 = uVar63 * 0xa8;
          lVar54 = CONCAT44(uStack_354,local_358);
          pdVar40 = (double *)(lVar54 + 0x10 + lVar45);
          dVar92 = *pdVar40;
          dVar21 = pdVar40[1];
          *(ulong *)(pVVar46->position).m_data =
               CONCAT44((float)((double *)(lVar54 + lVar45))[1],(float)*(double *)(lVar54 + lVar45))
          ;
          *(ulong *)((pVVar46->position).m_data + 2) = CONCAT44((float)dVar21,(float)dVar92);
          pdVar40 = (double *)(lVar54 + 0x48 + lVar45);
          dVar92 = *pdVar40;
          dVar21 = pdVar40[1];
          pdVar40 = (double *)(lVar54 + 0x38 + lVar45);
          *(ulong *)(pVVar47->position).m_data = CONCAT44((float)pdVar40[1],(float)*pdVar40);
          *(ulong *)((pVVar47->position).m_data + 2) = CONCAT44((float)dVar21,(float)dVar92);
          pdVar40 = (double *)(lVar54 + 0x80 + lVar45);
          auVar97._12_4_ = (float)pdVar40[1];
          auVar97._8_4_ = (float)*pdVar40;
          pdVar40 = (double *)(lVar54 + 0x70 + lVar45);
          auVar97._0_4_ = (float)*pdVar40;
          auVar97._4_4_ = (float)pdVar40[1];
          *(undefined1 (*) [16])(pVVar48->position).m_data = auVar97;
          pVVar76 = (pvVar53->
                    super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pVVar78 = (pvVar53->
                    super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          if (pVVar78 != pVVar76) {
            lVar45 = lVar45 + CONCAT44(uStack_354,local_358);
            lVar54 = 0;
            uVar61 = 0;
            do {
              if (*(int *)((long)&pVVar76->type + lVar54) == 0) {
                pTVar60 = (primList->
                          super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
                          _M_impl.super__Vector_impl_data._M_start;
                auVar107 = *(undefined1 (*) [16])
                            ((long)&(pTVar60[lVar69].v0)->outputs[0].v + lVar54 * 2);
                fVar102 = auVar107._0_4_;
                fVar108 = auVar107._4_4_;
                fVar109 = auVar107._8_4_;
                fVar110 = auVar107._12_4_;
                pfVar5 = (float *)((long)&(pTVar60[lVar69].v1)->outputs[0].v + lVar54 * 2);
                local_388._0_4_ = *pfVar5;
                fVar114 = pfVar5[1];
                fVar118 = pfVar5[2];
                fVar116 = pfVar5[3];
                fVar111 = (float)*(double *)(lVar45 + 0x20);
                auVar107 = *(undefined1 (*) [16])
                            ((long)&(pTVar60[lVar69].v2)->outputs[0].v + lVar54 * 2);
                fVar88 = auVar107._0_4_;
                fVar89 = auVar107._4_4_;
                fVar90 = auVar107._8_4_;
                fVar91 = auVar107._12_4_;
                fVar113 = (float)*(double *)(lVar45 + 0x28);
                fVar115 = (float)*(double *)(lVar45 + 0x30);
                pfVar5 = (float *)((long)&pVVar46->outputs[0].v + lVar54 * 2);
                *pfVar5 = fVar115 * fVar88 + fVar113 * local_388._0_4_ + fVar111 * fVar102;
                pfVar5[1] = fVar115 * fVar89 + fVar113 * fVar114 + fVar111 * fVar108;
                pfVar5[2] = fVar115 * fVar90 + fVar113 * fVar118 + fVar111 * fVar109;
                pfVar5[3] = fVar115 * fVar91 + fVar113 * fVar116 + fVar111 * fVar110;
                fVar111 = (float)*(double *)(lVar45 + 0x58);
                fVar113 = (float)*(double *)(lVar45 + 0x60);
                fVar115 = (float)*(double *)(lVar45 + 0x68);
                pfVar5 = (float *)((long)&pVVar47->outputs[0].v + lVar54 * 2);
                *pfVar5 = fVar115 * fVar88 + fVar113 * local_388._0_4_ + fVar111 * fVar102;
                pfVar5[1] = fVar115 * fVar89 + fVar113 * fVar114 + fVar111 * fVar108;
                pfVar5[2] = fVar115 * fVar90 + fVar113 * fVar118 + fVar111 * fVar109;
                pfVar5[3] = fVar115 * fVar91 + fVar113 * fVar116 + fVar111 * fVar110;
                fVar113 = (float)*(double *)(lVar45 + 0x90);
                fVar115 = (float)*(double *)(lVar45 + 0x98);
                fVar111 = (float)*(double *)(lVar45 + 0xa0);
                auVar98._0_4_ = fVar111 * fVar88 + fVar115 * local_388._0_4_ + fVar113 * fVar102;
                auVar98._4_4_ = fVar111 * fVar89 + fVar115 * fVar114 + fVar113 * fVar108;
                auVar98._8_4_ = fVar111 * fVar90 + fVar115 * fVar118 + fVar113 * fVar109;
                auVar98._12_4_ = fVar111 * fVar91 + fVar115 * fVar116 + fVar113 * fVar110;
                *(undefined1 (*) [16])((long)&pVVar48->outputs[0].v + lVar54 * 2) = auVar98;
              }
              else {
                pTVar60 = (primList->
                          super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
                          _M_impl.super__Vector_impl_data._M_start;
                iVar36 = pTVar60[lVar69].provokingIndex;
                pTVar60 = pTVar60 + lVar69;
                if (iVar36 != 0) {
                  if (iVar36 == 2) {
                    pTVar60 = (pointer)&pTVar60->v2;
                  }
                  else {
                    pTVar60 = (pointer)&pTVar60->v1;
                  }
                }
                pVVar13 = pTVar60->v0;
                *(undefined4 *)((long)&pVVar46->outputs[0].v + lVar54 * 2) =
                     *(undefined4 *)((long)&pVVar13->outputs[0].v + lVar54 * 2);
                *(undefined4 *)((long)&pVVar46->outputs[0].v + lVar54 * 2 + 4) =
                     *(undefined4 *)((long)&pVVar13->outputs[0].v + lVar54 * 2 + 4U);
                *(undefined4 *)((long)&pVVar46->outputs[0].v + lVar54 * 2 + 8) =
                     *(undefined4 *)((long)&pVVar13->outputs[0].v + lVar54 * 2 + 8U);
                *(undefined4 *)((long)&pVVar46->outputs[0].v + lVar54 * 2 + 0xc) =
                     *(undefined4 *)((long)&pVVar13->outputs[0].v + lVar54 * 2 + 0xcU);
                pTVar60 = (primList->
                          super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
                          _M_impl.super__Vector_impl_data._M_start;
                iVar36 = pTVar60[lVar69].provokingIndex;
                pTVar60 = pTVar60 + lVar69;
                if (iVar36 != 0) {
                  if (iVar36 == 2) {
                    pTVar60 = (pointer)&pTVar60->v2;
                  }
                  else {
                    pTVar60 = (pointer)&pTVar60->v1;
                  }
                }
                pVVar13 = pTVar60->v0;
                *(undefined4 *)((long)&pVVar47->outputs[0].v + lVar54 * 2) =
                     *(undefined4 *)((long)&pVVar13->outputs[0].v + lVar54 * 2);
                *(undefined4 *)((long)&pVVar47->outputs[0].v + lVar54 * 2 + 4) =
                     *(undefined4 *)((long)&pVVar13->outputs[0].v + lVar54 * 2 + 4U);
                *(undefined4 *)((long)&pVVar47->outputs[0].v + lVar54 * 2 + 8) =
                     *(undefined4 *)((long)&pVVar13->outputs[0].v + lVar54 * 2 + 8U);
                *(undefined4 *)((long)&pVVar47->outputs[0].v + lVar54 * 2 + 0xc) =
                     *(undefined4 *)((long)&pVVar13->outputs[0].v + lVar54 * 2 + 0xcU);
                pTVar60 = (primList->
                          super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
                          _M_impl.super__Vector_impl_data._M_start;
                iVar36 = pTVar60[lVar69].provokingIndex;
                pTVar60 = pTVar60 + lVar69;
                if (iVar36 != 0) {
                  if (iVar36 == 2) {
                    pTVar60 = (pointer)&pTVar60->v2;
                  }
                  else {
                    pTVar60 = (pointer)&pTVar60->v1;
                  }
                }
                pVVar13 = pTVar60->v0;
                *(undefined4 *)((long)&pVVar48->outputs[0].v + lVar54 * 2) =
                     *(undefined4 *)((long)&pVVar13->outputs[0].v + lVar54 * 2);
                *(undefined4 *)((long)&pVVar48->outputs[0].v + lVar54 * 2 + 4) =
                     *(undefined4 *)((long)&pVVar13->outputs[0].v + lVar54 * 2 + 4U);
                *(undefined4 *)((long)&pVVar48->outputs[0].v + lVar54 * 2 + 8) =
                     *(undefined4 *)((long)&pVVar13->outputs[0].v + lVar54 * 2 + 8U);
                *(undefined4 *)((long)&pVVar48->outputs[0].v + lVar54 * 2 + 0xc) =
                     *(undefined4 *)((long)&pVVar13->outputs[0].v + lVar54 * 2 + 0xcU);
                pVVar76 = (pvVar53->
                          super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                pVVar78 = (pvVar53->
                          super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
              }
              uVar61 = uVar61 + 1;
              lVar54 = lVar54 + 8;
            } while (uVar61 < (ulong)((long)pVVar78 - (long)pVVar76 >> 3));
          }
          if (outputTriangles.
              super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              outputTriangles.
              super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>::
            _M_realloc_insert<rr::pa::Triangle_const&>
                      ((vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>> *)&outputTriangles
                       ,(iterator)
                        outputTriangles.
                        super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>.
                        _M_impl.super__Vector_impl_data._M_finish,(Triangle *)&mid1);
          }
          else {
            (outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>
             ._M_impl.super__Vector_impl_data._M_finish)->v2 = pVVar48;
            (outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>
             ._M_impl.super__Vector_impl_data._M_finish)->provokingIndex = 0xffffffff;
            *(undefined4 *)
             &(outputTriangles.
               super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
               super__Vector_impl_data._M_finish)->field_0x1c = mid1.position.m_data[3]._4_4_;
            (outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>
             ._M_impl.super__Vector_impl_data._M_finish)->v0 = pVVar46;
            (outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>
             ._M_impl.super__Vector_impl_data._M_finish)->v1 = pVVar47;
            outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 outputTriangles.
                 super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          uVar63 = uVar63 + 1;
        } while (uVar63 != (uVar83 & 0x7fffffff));
      }
      pvVar50 = (void *)CONCAT44(uStack_354,local_358);
      if (pvVar50 != (void *)0x0) {
        operator_delete(pvVar50,(long)local_2e0 - (long)pvVar50);
      }
LAB_0195d54f:
      lVar69 = lVar69 + 1;
      pTVar60 = (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pTVar59 = (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      pTVar49 = outputTriangles.
                super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pTVar70 = outputTriangles.
                super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (lVar69 < (int)((ulong)((long)pTVar59 - (long)pTVar60) >> 5));
  }
  pTVar14 = (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>)._M_impl.
  super__Vector_impl_data._M_start = pTVar70;
  (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>)._M_impl.
  super__Vector_impl_data._M_finish = pTVar49;
  (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
  super__Vector_impl_data._M_finish = pTVar59;
  outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
  super__Vector_impl_data._M_start = pTVar60;
  outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pTVar14;
  if (pTVar60 != (pointer)0x0) {
    operator_delete(pTVar60,(long)pTVar14 - (long)pTVar60);
    pTVar70 = (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pTVar49 = (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  }
  if (pTVar70 != pTVar49) {
    do {
      anon_unknown_19::transformVertexClipCoordsToWindowCoords(state,pTVar70->v0);
      anon_unknown_19::transformVertexClipCoordsToWindowCoords(state,pTVar70->v1);
      anon_unknown_19::transformVertexClipCoordsToWindowCoords(state,pTVar70->v2);
      pTVar70 = pTVar70 + 1;
    } while (pTVar70 !=
             (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  }
  iVar36 = *(int *)&renderTarget->field_0x8;
  pFVar15 = (program->fragmentShader->m_outputs).
            super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pFVar16 = (program->fragmentShader->m_outputs).
            super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar63._0_4_ = (state->viewport).rect.left;
  uVar63._4_4_ = (state->viewport).rect.bottom;
  uVar61._0_4_ = (state->viewport).rect.width;
  uVar61._4_4_ = (state->viewport).rect.height;
  stack0xfffffffffffffc80 = 0;
  local_388._0_8_ = uVar61;
  MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)&mid1,(MultisamplePixelBufferAccess *)renderTarget
            );
  auVar94._4_4_ = mid1.position.m_data[2]._0_4_;
  auVar94._0_4_ = mid1.position.m_data[1]._4_4_;
  auVar94._8_8_ = 0;
  uVar55 = CONCAT44(-(uint)(0 < (int)uVar63._4_4_),-(uint)(0 < (int)(undefined4)uVar63)) & uVar63;
  auVar99._0_8_ =
       CONCAT44(-(uint)((int)(uVar61._4_4_ + uVar63._4_4_) < mid1.position.m_data[2]._0_4_),
                -(uint)((int)((undefined4)uVar61 + (undefined4)uVar63) <
                       mid1.position.m_data[1]._4_4_));
  auVar99._8_8_ = 0;
  auVar112._8_8_ = 0;
  auVar112._0_8_ =
       CONCAT44(uVar61._4_4_ + uVar63._4_4_,(undefined4)uVar61 + (undefined4)uVar63) & auVar99._0_8_
  ;
  auVar112 = ~auVar99 & auVar94 | auVar112;
  register0x0000128c = auVar112._4_4_ - (int)(uVar55 >> 0x20);
  register0x00001288 = auVar112._0_4_ - (int)uVar55;
  clipPosX.super_ClipVolumePlane._vptr_ClipVolumePlane._0_4_ = (int)uVar55;
  clipPosX.super_ClipVolumePlane._vptr_ClipVolumePlane._4_4_ = (int)(uVar55 >> 0x20);
  pvVar50 = operator_new(0x2000);
  memset(pvVar50,0,0x2000);
  std::vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>::vector
            ((vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_> *)&anotherPointOnLine,
             ((long)pFVar15 - (long)pFVar16) * 0x40000000 >> 0x17,(allocator_type *)&mid1);
  pvVar51 = operator_new(0x7000);
  lVar75 = 0;
  do {
    *(undefined8 *)((long)pvVar51 + lVar75 + 0x30) = 0;
    *(undefined1 (*) [16])((long)pvVar51 + lVar75) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)pvVar51 + lVar75 + 0x10) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)pvVar51 + lVar75 + 0x1c) = (undefined1  [16])0x0;
    lVar75 = lVar75 + 0x38;
  } while (lVar75 != 0x7000);
  outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  stack0xfffffffffffffde8 = (undefined1  [16])0x0;
  mid2.weight[0] = 0.0;
  mid2.weight[1] = 0.0;
  mid2.position.m_data[2] = 0.0;
  mid2.position.m_data[3] = 0.0;
  mid2.position.m_data[0] = 0.0;
  mid2.position.m_data[1] = 0.0;
  MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)&mid1,&renderTarget->m_depthBuffer);
  if (((mid1.position.m_data[1]._0_4_ == 0) || (mid1.position.m_data[1]._4_4_ == 0)) ||
     (mid1.position.m_data[2]._0_4_ == 0)) {
    pTVar60 = (pointer)0x0;
  }
  else {
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)&outputTriangles,(long)iVar36 << 9);
    pTVar60 = outputTriangles.
              super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  dVar92 = anotherPointOnLine.m_data[0];
  mid2.position.m_data[1] = (double)((long)pvVar50 + 0x2000);
  mid2.position.m_data[0] = (double)pvVar50;
  mid2.position.m_data[3] = anotherPointOnLine.m_data[0];
  mid2.position.m_data[2] = (double)((long)pvVar50 + 0x2000);
  mid2.weight[1] = anotherPointOnLine.m_data[2];
  mid2.weight[0] = anotherPointOnLine.m_data[1];
  anotherPointOnLine.m_data[0] = 0.0;
  anotherPointOnLine.m_data[1] = 0.0;
  anotherPointOnLine.m_data[2] = 0.0;
  lStack_210 = (long)pvVar51 + 0x7000;
  mid2.weight[2] = (ClipFloat)pvVar51;
  pTVar59 = (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pvVar50 = pvVar51;
  if (pTVar59 !=
      (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      iVar36 = *(int *)&renderTarget->field_0x8;
      fVar114 = (state->viewport).zn;
      fVar118 = (state->viewport).zf;
      TriangleRasterizer::TriangleRasterizer
                ((TriangleRasterizer *)&mid1,(IVec4 *)&clipPosX,iVar36,&state->rasterization);
      TriangleRasterizer::init((TriangleRasterizer *)&mid1,(EVP_PKEY_CTX *)&pTVar59->v0->position);
      auVar105 = local_388;
      if ((state->cullMode != CULLMODE_FRONT || local_c8 != FACETYPE_FRONT) &&
         (local_c8 != FACETYPE_BACK || state->cullMode != CULLMODE_BACK)) {
        FragmentShadingContext::FragmentShadingContext
                  ((FragmentShadingContext *)planes,pTVar59->v0->outputs,pTVar59->v1->outputs,
                   pTVar59->v2->outputs,(GenericVec4 *)dVar92,(float *)pTVar60,
                   (int)((ulong)((long)(program->fragmentShader->m_outputs).
                                       super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(program->fragmentShader->m_outputs).
                                      super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2),iVar36,
                   local_c8,(FaceType)local_388._0_4_);
        auVar105 = (undefined1  [16])0x0;
        if (pTVar60 == (pointer)0x0) {
          pTVar70 = (pointer)0x0;
        }
        else {
          pTVar70 = pTVar60;
          if ((state->fragOps).polygonOffsetEnabled == true) {
            p = &pTVar59->v0->position;
            v0 = &pTVar59->v1->position;
            v1 = &pTVar59->v2->position;
            fVar89 = anon_unknown_19::findTriangleVertexDepthSlope(p,v0,v1);
            fVar90 = anon_unknown_19::findTriangleVertexDepthSlope(v0,v1,p);
            fVar91 = anon_unknown_19::findTriangleVertexDepthSlope(v1,p,v0);
            MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
                      ((MultisampleConstPixelBufferAccess *)&approximatedClipPoint,
                       &renderTarget->m_depthBuffer);
            fVar116 = (pTVar59->v0->position).m_data[2];
            fVar88 = (pTVar59->v1->position).m_data[2];
            uVar83 = -(uint)(fVar88 <= fVar116);
            fVar88 = (float)(~uVar83 & (uint)fVar88 | (uint)fVar116 & uVar83);
            fVar116 = (pTVar59->v2->position).m_data[2];
            uVar83 = -(uint)(fVar116 <= fVar88);
            uVar83 = ~uVar83 & (uint)fVar116 | uVar83 & (uint)fVar88;
            clipNegX.super_ClipVolumePlane._vptr_ClipVolumePlane =
                 (ClipVolumePlane)(ClipVolumePlane)approximatedClipPoint.m_data[0];
            auVar34 = _auStack_384;
            auVar31._12_4_ = 0;
            auVar31._0_12_ = _auStack_384;
            local_388 = auVar31 << 0x20;
            channelType = (ChannelType)((ulong)approximatedClipPoint.m_data[0] >> 0x20);
            if (SUB84(approximatedClipPoint.m_data[0],0) == 0x14) {
              if (channelType == UNSIGNED_INT_24_8) {
                iVar37 = 0x33800000;
LAB_0195daee:
                local_388._0_4_ = (float)iVar37;
              }
              else if (channelType == FLOAT_UNSIGNED_INT_24_8_REV) {
LAB_0195da95:
                iVar37 = (uVar83 & 0x7f800000) + 0xf4800000;
                local_388._0_4_ = -1.6225928e+32;
                local_388 = CONCAT124(auVar34,local_388._0_4_);
                if ((uVar83 & 0x7fffff) == 0) {
                  local_388._0_4_ = (float)iVar37;
                  local_388 = CONCAT124(auVar34,local_388._0_4_);
                }
                if ((uVar83 & 0x7f800000) != 0) goto LAB_0195daee;
              }
            }
            else if (SUB84(approximatedClipPoint.m_data[0],0) == 0x12) {
              TVar39 = tcu::getTextureChannelClass(channelType);
              tcu::getTextureFormatBitDepth((tcu *)&local_348,(TextureFormat *)&clipNegX);
              if (TVar39 == TEXTURECHANNELCLASS_FLOATING_POINT) {
                if (channelType == FLOAT) goto LAB_0195da95;
              }
              else {
                local_388._0_4_ =
                     (float)((int)local_348.
                                  super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                  ._M_impl.super__Vector_impl_data._M_start * -0x800000 + 0x3f800000
                            );
                local_388 = CONCAT124(auVar34,local_388._0_4_);
              }
            }
            fVar116 = (float)(~-(uint)(fVar91 <= fVar90) & (uint)fVar91 |
                             (uint)fVar90 & -(uint)(fVar91 <= fVar90));
            uVar83 = -(uint)(fVar116 <= fVar89);
            auVar106._0_4_ = uVar83 & (uint)fVar89;
            auVar106._4_4_ = extraout_XMM0_Db_00 & extraout_XMM0_Db_01 & extraout_XMM0_Db;
            auVar106._8_4_ = extraout_XMM0_Dc_00 & extraout_XMM0_Dc_01 & extraout_XMM0_Dc;
            auVar106._12_4_ = extraout_XMM0_Dd_00 & extraout_XMM0_Dd_01 & extraout_XMM0_Dd;
            auVar106 = auVar106 | ZEXT416(~uVar83 & (uint)fVar116);
            auVar105._4_12_ = auVar106._4_12_;
            auVar105._0_4_ =
                 auVar106._0_4_ * (state->fragOps).polygonOffsetFactor +
                 local_388._0_4_ * (state->fragOps).polygonOffsetUnits;
          }
        }
        approximatedClipPoint.m_data[0] =
             (double)((ulong)approximatedClipPoint.m_data[0] & 0xffffffff00000000);
        TriangleRasterizer::rasterize
                  ((TriangleRasterizer *)&mid1,(FragmentPacket *)mid2.position.m_data[0],
                   (float *)pTVar70,
                   (int)((ulong)((long)mid2.position.m_data[1] - (long)mid2.position.m_data[0]) >> 6
                        ),(int *)&approximatedClipPoint);
        auVar107 = (undefined1  [16])0x0;
        local_388._0_4_ = auVar105._0_4_;
        if (approximatedClipPoint.m_data[0]._0_4_ != 0) {
          fVar116 = (float)(~-(uint)(fVar114 <= fVar118) & (uint)fVar118 |
                           -(uint)(fVar114 <= fVar118) & (uint)fVar114);
          local_308._4_4_ =
               ~-(uint)(fVar118 <= fVar114) & (uint)fVar118 |
               (uint)fVar114 & -(uint)(fVar118 <= fVar114);
          dVar21 = mid2.position.m_data[0];
          uVar63 = (long)mid2.position.m_data[1] - (long)mid2.position.m_data[0];
          local_308._0_4_ = local_308._4_4_;
          local_308._8_4_ = local_308._4_4_;
          local_308._12_4_ = local_308._4_4_;
          auStack_384._0_4_ = local_388._0_4_;
          auStack_384._4_4_ = local_388._0_4_;
          fStack_37c = local_388._0_4_;
          do {
            auVar101 = _DAT_01a1c5b0;
            if (((pTVar60 != (pointer)0x0) && ((state->fragOps).polygonOffsetEnabled == true)) &&
               (uVar83 = approximatedClipPoint.m_data[0]._0_4_ * iVar36 * 4, 0 < (int)uVar83)) {
              uVar61 = 0;
              do {
                pfVar5 = (float *)((long)&pTVar60->v0 + uVar61 * 4);
                auVar95._0_4_ = *pfVar5 + local_388._0_4_;
                auVar95._4_4_ = pfVar5[1] + local_388._0_4_;
                auVar95._8_4_ = pfVar5[2] + local_388._0_4_;
                auVar95._12_4_ = pfVar5[3] + local_388._0_4_;
                auVar100 = minps(auVar101,auVar95);
                pfVar5 = (float *)((long)&pTVar60->v0 + uVar61 * 4);
                *pfVar5 = (float)(-(uint)(0.0 <= auVar95._0_4_) & auVar100._0_4_);
                pfVar5[1] = (float)(-(uint)(0.0 <= auVar95._4_4_) & auVar100._4_4_);
                pfVar5[2] = (float)(-(uint)(auVar107._8_4_ <= auVar95._8_4_) & auVar100._8_4_);
                pfVar5[3] = (float)(-(uint)(0.0 <= auVar95._12_4_) & auVar100._12_4_);
                uVar61 = uVar61 + 4;
              } while (uVar83 != uVar61);
            }
            (**program->fragmentShader->_vptr_FragmentShader)(program->fragmentShader,dVar21);
            if (((pTVar60 != (pointer)0x0) && ((state->fragOps).depthClampEnabled == true)) &&
               (uVar83 = approximatedClipPoint.m_data[0]._0_4_ * iVar36 * 4, 0 < (int)uVar83)) {
              uVar61 = 0;
              do {
                auVar107 = *(undefined1 (*) [16])((long)&pTVar60->v0 + uVar61 * 4);
                auVar101 = minps(local_308,auVar107);
                uVar84 = -(uint)(auVar107._0_4_ < fVar116);
                uVar85 = -(uint)(auVar107._4_4_ < fVar116);
                uVar86 = -(uint)(auVar107._8_4_ < fVar116);
                uVar87 = -(uint)(auVar107._12_4_ < fVar116);
                pfVar5 = (float *)((long)&pTVar60->v0 + uVar61 * 4);
                *pfVar5 = (float)(~uVar84 & auVar101._0_4_ | (uint)fVar116 & uVar84);
                pfVar5[1] = (float)(~uVar85 & auVar101._4_4_ | (uint)fVar116 & uVar85);
                pfVar5[2] = (float)(~uVar86 & auVar101._8_4_ | (uint)fVar116 & uVar86);
                pfVar5[3] = (float)(~uVar87 & auVar101._12_4_ | (uint)fVar116 & uVar87);
                uVar61 = uVar61 + 4;
              } while (uVar83 != uVar61);
            }
            anon_unknown_19::writeFragmentPackets
                      ((anon_unknown_19 *)state,(RenderState *)renderTarget,
                       (RenderTarget *)
                       (program->fragmentShader->m_outputs).
                       super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (Program *)
                       (program->fragmentShader->m_outputs).
                       super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(FragmentPacket *)dVar21,
                       approximatedClipPoint.m_data[0]._0_4_,local_c8,
                       (vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_> *)
                       (mid2.position.m_data + 3),(float *)pTVar60,
                       (vector<rr::Fragment,_std::allocator<rr::Fragment>_> *)(mid2.weight + 2));
            approximatedClipPoint.m_data[0] =
                 (double)((ulong)approximatedClipPoint.m_data[0] & 0xffffffff00000000);
            TriangleRasterizer::rasterize
                      ((TriangleRasterizer *)&mid1,(FragmentPacket *)dVar21,(float *)pTVar60,
                       (int)(uVar63 >> 6),(int *)&approximatedClipPoint);
            auVar107 = ZEXT816(0);
            auVar105 = local_388;
          } while (approximatedClipPoint.m_data[0]._0_4_ != 0);
        }
      }
      local_388 = auVar105;
      pTVar59 = pTVar59 + 1;
    } while (pTVar59 !=
             (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
             _M_impl.super__Vector_impl_data._M_finish);
    pvVar50 = (void *)mid2.weight[2];
    if (mid2.weight[2] == 0.0) goto LAB_0195dda0;
  }
  operator_delete(pvVar50,(long)pvVar51 + (0x7000 - (long)pvVar50));
LAB_0195dda0:
  if (mid2.position.m_data[3] != 0.0) {
    operator_delete((void *)mid2.position.m_data[3],
                    (long)mid2.weight[1] - (long)mid2.position.m_data[3]);
  }
  if (mid2.position.m_data[0] != 0.0) {
    operator_delete((void *)mid2.position.m_data[0],
                    (long)mid2.position.m_data[2] - (long)mid2.position.m_data[0]);
  }
  if (outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(outputTriangles.
                    super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)outputTriangles.
                          super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)outputTriangles.
                          super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (anotherPointOnLine.m_data[0] != 0.0) {
    operator_delete((void *)anotherPointOnLine.m_data[0],
                    (long)anotherPointOnLine.m_data[2] - (long)anotherPointOnLine.m_data[0]);
  }
  return;
}

Assistant:

void drawBasicPrimitives (const RenderState& state, const RenderTarget& renderTarget, const Program& program, ContainerType& primList, VertexPacketAllocator& vpalloc)
{
	const bool clipZ = !state.fragOps.depthClampEnabled;

	// Transform feedback

	// Flatshading
	flatshadeVertices(program, primList);

	// Clipping
	// \todo [jarkko] is creating & swapping std::vectors really a good solution?
	clipPrimitives(primList, program, clipZ, vpalloc);

	// Transform vertices to window coords
	transformClipCoordsToWindowCoords(state, primList);

	// Rasterize and paint
	rasterize(state, renderTarget, program, primList);
}